

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockExpectedCall_callWithObjectParameter_Test::testBody
          (TEST_MockExpectedCall_callWithObjectParameter_Test *this)

{
  MockCheckedExpectedCall *pMVar1;
  undefined8 uVar2;
  UtestShell *pUVar3;
  void *pvVar4;
  TestTerminator *pTVar5;
  char *pcVar6;
  SimpleString local_b8;
  SimpleString local_a8;
  MockNamedValue local_98;
  SimpleString local_38;
  undefined8 local_28;
  void *value;
  SimpleString paramName;
  TEST_MockExpectedCall_callWithObjectParameter_Test *this_local;
  
  paramName.bufferSize_ = (size_t)this;
  SimpleString::SimpleString((SimpleString *)&value,"paramName");
  local_28 = 0x123;
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  SimpleString::SimpleString(&local_38,"ClassName");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[5])(pMVar1,&local_38,&value,local_28);
  SimpleString::~SimpleString(&local_38);
  pUVar3 = UtestShell::getCurrent();
  uVar2 = local_28;
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x26])(&local_98,pMVar1,&value);
  pvVar4 = MockNamedValue::getConstObjectPointer(&local_98);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0x13])
            (pUVar3,uVar2,pvVar4,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x153,pTVar5);
  MockNamedValue::~MockNamedValue(&local_98);
  pUVar3 = UtestShell::getCurrent();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x28])(&local_a8,pMVar1,&value);
  pcVar6 = SimpleString::asCharString(&local_a8);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[9])
            (pUVar3,"ClassName",pcVar6,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x154,pTVar5);
  SimpleString::~SimpleString(&local_a8);
  pUVar3 = UtestShell::getCurrent();
  (*(((this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call)->super_MockExpectedCall).
    _vptr_MockExpectedCall[0x3c])(&local_b8);
  pcVar6 = SimpleString::asCharString(&local_b8);
  (*pUVar3->_vptr_UtestShell[0xc])
            (pUVar3,"funcName -> ClassName paramName: <No comparator found for type: \"ClassName\">"
             ,pcVar6,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x155);
  SimpleString::~SimpleString(&local_b8);
  SimpleString::~SimpleString((SimpleString *)&value);
  return;
}

Assistant:

TEST(MockExpectedCall, callWithObjectParameter)
{
    const SimpleString paramName = "paramName";
    void* value = (void*) 0x123;
    call->withParameterOfType("ClassName", paramName, value);
    POINTERS_EQUAL(value, call->getInputParameter(paramName).getConstObjectPointer());
    STRCMP_EQUAL("ClassName", call->getInputParameterType(paramName).asCharString());
    STRCMP_CONTAINS("funcName -> ClassName paramName: <No comparator found for type: \"ClassName\">", call->callToString().asCharString());
}